

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O2

QLocaleId __thiscall QLocaleId::withLikelySubtagsAdded(QLocaleId *this)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  bool bVar6;
  uint uVar7;
  QLocaleId *__first;
  LikelyPair *pLVar8;
  uint uVar9;
  ulong uVar10;
  ulong uVar11;
  ushort uVar12;
  ulong uVar13;
  long in_FS_OFFSET;
  LikelyPair local_3c;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_3c.key.territory_id = this->territory_id;
  local_3c.key.language_id = this->language_id;
  local_3c.key.script_id = this->script_id;
  local_3c.value.language_id = 0;
  local_3c.value.script_id = 0;
  local_3c.value.territory_id = 0;
  uVar1 = this->language_id;
  uVar11 = (ulong)uVar1;
  if (uVar1 == 0) {
    uVar10 = (ulong)this->territory_id;
    __first = likely_subtags;
  }
  else {
    __first = &std::
               lower_bound<(anonymous_namespace)::LikelyPair_const*,(anonymous_namespace)::LikelyPair>
                         ((LikelyPair *)likely_subtags,(LikelyPair *)"en",&local_3c)->key;
    uVar2 = this->script_id;
    uVar3 = this->territory_id;
    uVar13 = (ulong)uVar3;
    for (; (uVar10 = uVar13, __first < "en" && ((((LikelyPair *)__first)->key).language_id == uVar1)
           ); __first = (QLocaleId *)((long)__first + 0xc)) {
      uVar4 = (((LikelyPair *)__first)->key).territory_id;
      if ((uVar4 == uVar3 || uVar4 == 0) &&
         ((uVar5 = (((LikelyPair *)__first)->key).script_id, uVar5 == 0 || (uVar5 == uVar2)))) {
        uVar9 = (uint)(((LikelyPair *)__first)->value).territory_id;
        uVar10 = (ulong)uVar9;
        if (uVar4 == 0) {
          uVar10 = uVar13;
        }
        if (uVar3 == 0) {
          uVar10 = (ulong)uVar9;
        }
        uVar1 = (((LikelyPair *)__first)->value).script_id;
        uVar3 = uVar1;
        if (uVar5 == 0) {
          uVar3 = uVar2;
        }
        uVar9 = (uint)uVar3;
        uVar11 = (ulong)(((LikelyPair *)__first)->value).language_id;
        if (uVar2 == 0) {
          uVar9 = (uint)uVar1;
        }
        goto LAB_00116c0b;
      }
    }
  }
  uVar2 = this->script_id;
  uVar12 = (ushort)uVar10;
  if (uVar12 != 0) {
    local_3c.key._0_4_ = (uint)uVar2 << 0x10;
    local_3c.key.territory_id = uVar12;
    for (__first = &std::
                    lower_bound<(anonymous_namespace)::LikelyPair_const*,(anonymous_namespace)::LikelyPair>
                              ((LikelyPair *)__first,(LikelyPair *)"en",&local_3c)->key;
        (__first < "en" && ((((LikelyPair *)__first)->key).territory_id == uVar12));
        __first = (QLocaleId *)((long)__first + 0xc)) {
      uVar3 = (((LikelyPair *)__first)->key).script_id;
      if ((uVar3 == 0) || (uVar3 == uVar2)) {
        if (uVar1 == 0) {
          uVar11 = (ulong)(((LikelyPair *)__first)->value).language_id;
        }
        uVar1 = (((LikelyPair *)__first)->value).script_id;
        uVar4 = uVar1;
        if (uVar3 == 0) {
          uVar4 = uVar2;
        }
        uVar10 = (ulong)(((LikelyPair *)__first)->value).territory_id;
        if (uVar2 == 0) {
          uVar4 = uVar1;
        }
        uVar9 = (uint)uVar4;
        goto LAB_00116c0b;
      }
    }
  }
  if (uVar2 != 0) {
    local_3c.key._0_4_ = (uint)uVar2 << 0x10;
    local_3c.key.territory_id = 0;
    pLVar8 = std::
             lower_bound<(anonymous_namespace)::LikelyPair_const*,(anonymous_namespace)::LikelyPair>
                       ((LikelyPair *)__first,(LikelyPair *)"en",&local_3c);
    if ((pLVar8 < "en") && ((pLVar8->key).script_id == uVar2)) {
      if (uVar1 == 0) {
        uVar11 = (ulong)(pLVar8->value).language_id;
      }
      if (uVar12 == 0) {
        uVar10 = (ulong)(pLVar8->value).territory_id;
      }
      uVar9 = (uint)(pLVar8->value).script_id;
      goto LAB_00116c0b;
    }
  }
  bVar6 = matchesAll(likely_subtags + 0x628);
  uVar1 = this->language_id;
  uVar11 = (ulong)uVar1;
  if (bVar6) {
    uVar7 = 0x4b;
    if (uVar1 != 0) {
      uVar7 = (uint)uVar1;
    }
    uVar10 = 0xf8;
    if (this->territory_id != 0) {
      uVar10 = (ulong)this->territory_id;
    }
    uVar9 = 0x42;
    if (this->script_id != 0) {
      uVar9 = (uint)this->script_id;
    }
    uVar11 = (ulong)uVar7;
  }
  else {
    uVar9 = (uint)this->script_id;
    uVar10 = (ulong)this->territory_id;
  }
LAB_00116c0b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return (QLocaleId)((uint6)uVar11 | (uint6)(uVar9 << 0x10) | (uint6)(uVar10 << 0x20));
  }
  __stack_chk_fail();
}

Assistant:

QLocaleId QLocaleId::withLikelySubtagsAdded() const noexcept
{
    /* Each pattern that appears in a comments below, language_script_region and
       similar, indicates which of this's fields (even if blank) are being
       attended to in a given search; for fields left out of the pattern, the
       search uses 0 regardless of whether this has specified the field.

       If a key matches what we're searching for (possibly with a wildcard in
       the key matching a non-wildcard in our search), the tags from this that
       are specified in the key are replaced by the match (even if different);
       but the other tags of this replace what's in the match (even when the
       match does specify a value).

       Keep QLocaleXmlReader.__fillLikely() in sync with this, to ensure
       locale-appropriate time-zone naming works correctly.
    */
    static_assert(std::size(likely_subtags) % 2 == 0);
    auto *pairs = reinterpret_cast<const LikelyPair *>(likely_subtags);
    auto *const afterPairs = pairs + std::size(likely_subtags) / 2;
    LikelyPair sought { *this };
    // Our array is sorted in the order that puts all candidate matches in the
    // order we would want them; ones we should prefer appear before the others.
    if (language_id) {
        // language_script_region, language_region, language_script, language:
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Single language's block isn't long enough to warrant more binary
        // chopping within it - just traverse it all:
        for (; pairs < afterPairs && pairs->key.language_id == language_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            if (key.territory_id && key.territory_id != territory_id)
                continue;
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (territory_id && !key.territory_id)
                value.territory_id = territory_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script_region or und_region (in that order):
    if (territory_id) {
        sought.key = QLocaleId { 0, script_id, territory_id };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        // Again, individual und_?_region block isn't long enough to make binary
        // chop a win:
        for (; pairs < afterPairs && pairs->key.territory_id == territory_id; ++pairs) {
            const QLocaleId &key = pairs->key;
            Q_ASSERT(!key.language_id);
            if (key.script_id && key.script_id != script_id)
                continue;
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (script_id && !key.script_id)
                value.script_id = script_id;
            return value;
        }
    }
    // und_script:
    if (script_id) {
        sought.key = QLocaleId { 0, script_id, 0 };
        pairs = std::lower_bound(pairs, afterPairs, sought);
        if (pairs < afterPairs && pairs->key.script_id == script_id) {
            Q_ASSERT(!pairs->key.language_id && !pairs->key.territory_id);
            QLocaleId value = pairs->value;
            if (language_id)
                value.language_id = language_id;
            if (territory_id)
                value.territory_id = territory_id;
            return value;
        }
    }
    // Finally, fall back to the match-all rule (if there is one):
    pairs = afterPairs - 1; // All other keys are < match-all.
    if (pairs->key.matchesAll()) {
        QLocaleId value = pairs->value;
        if (language_id)
            value.language_id = language_id;
        if (territory_id)
            value.territory_id = territory_id;
        if (script_id)
            value.script_id = script_id;
        return value;
    }
    return *this;
}